

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O0

short bdf_atos_(char *s)

{
  short local_1a;
  short neg;
  byte *pbStack_18;
  short v;
  char *s_local;
  
  if ((s == (char *)0x0) || (*s == '\0')) {
    s_local._6_2_ = 0;
  }
  else {
    pbStack_18 = (byte *)s;
    if (*s == '-') {
      pbStack_18 = (byte *)(s + 1);
    }
    local_1a = 0;
    while (((uint)""[(int)(uint)*pbStack_18 >> 3] & 1 << (*pbStack_18 & 7)) != 0) {
      if (0xcca < local_1a) {
        local_1a = 0x7fff;
        break;
      }
      local_1a = local_1a * 10 + (ushort)""[(int)(char)*pbStack_18];
      pbStack_18 = pbStack_18 + 1;
    }
    s_local._6_2_ = local_1a;
    if (*s == '-') {
      s_local._6_2_ = -local_1a;
    }
  }
  return s_local._6_2_;
}

Assistant:

static short
  bdf_atos_( const char*  s )
  {
    short  v, neg;


    if ( s == NULL || *s == 0 )
      return 0;

    /* Check for a minus. */
    neg = 0;
    if ( *s == '-' )
    {
      s++;
      neg = 1;
    }

    for ( v = 0; sbitset( ddigits, *s ); s++ )
    {
      if ( v < ( SHRT_MAX - 9 ) / 10 )
        v = (short)( v * 10 + a2i[(int)*s] );
      else
      {
        v = SHRT_MAX;
        break;
      }
    }

    return (short)( ( !neg ) ? v : -v );
  }